

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_function_set.cpp
# Opt level: O3

BoundCastInfo * __thiscall
duckdb::CastFunctionSet::GetCastFunction
          (BoundCastInfo *__return_storage_ptr__,CastFunctionSet *this,LogicalType *source,
          LogicalType *target,GetCastFunctionInput *get_input)

{
  bool bVar1;
  reference pvVar2;
  pointer *__ptr;
  long lVar3;
  size_type __n;
  _Head_base<0UL,_duckdb::BoundCastData_*,_false> _Var4;
  BindCastInput input;
  _Head_base<0UL,_duckdb::BoundCastData_*,_false> local_78;
  _Head_base<0UL,_duckdb::BoundCastData_*,_false> local_70;
  vector<duckdb::BindCastFunction,_true> *local_68;
  LogicalType *local_60;
  LogicalType *local_58;
  BindCastInput local_50;
  
  local_60 = source;
  local_58 = target;
  bVar1 = LogicalType::operator==(source,target);
  if (bVar1) {
    local_70._M_head_impl = (BoundCastData *)0x0;
    BoundCastInfo::BoundCastInfo
              (__return_storage_ptr__,DefaultCasts::NopCast,
               (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                *)&local_70,(init_cast_local_state_t)0x0);
    _Var4._M_head_impl = local_70._M_head_impl;
  }
  else {
    lVar3 = (long)(this->bind_functions).
                  super_vector<duckdb::BindCastFunction,_std::allocator<duckdb::BindCastFunction>_>.
                  super__Vector_base<duckdb::BindCastFunction,_std::allocator<duckdb::BindCastFunction>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)(this->bind_functions).
                  super_vector<duckdb::BindCastFunction,_std::allocator<duckdb::BindCastFunction>_>.
                  super__Vector_base<duckdb::BindCastFunction,_std::allocator<duckdb::BindCastFunction>_>
                  ._M_impl.super__Vector_impl_data._M_start;
    if (lVar3 != 0) {
      local_68 = &this->bind_functions;
      __n = lVar3 >> 4;
      do {
        __n = __n - 1;
        pvVar2 = vector<duckdb::BindCastFunction,_true>::operator[](local_68,__n);
        BindCastInput::BindCastInput
                  (&local_50,this,
                   (optional_ptr<duckdb::BindCastInfo,_true>)
                   (pvVar2->info).
                   super_unique_ptr<duckdb::BindCastInfo,_std::default_delete<duckdb::BindCastInfo>_>
                   ._M_t.
                   super___uniq_ptr_impl<duckdb::BindCastInfo,_std::default_delete<duckdb::BindCastInfo>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_duckdb::BindCastInfo_*,_std::default_delete<duckdb::BindCastInfo>_>
                   .super__Head_base<0UL,_duckdb::BindCastInfo_*,_false>._M_head_impl,
                   (get_input->context).ptr);
        local_50.query_location.index = (get_input->query_location).index;
        (*pvVar2->function)(__return_storage_ptr__,&local_50,local_60,local_58);
        if (__return_storage_ptr__->function != (cast_function_t)0x0) {
          return __return_storage_ptr__;
        }
        _Var4._M_head_impl =
             (__return_storage_ptr__->cast_data).
             super_unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>_>.
             _M_t.
             super___uniq_ptr_impl<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>_>
             ._M_t.
             super__Tuple_impl<0UL,_duckdb::BoundCastData_*,_std::default_delete<duckdb::BoundCastData>_>
             .super__Head_base<0UL,_duckdb::BoundCastData_*,_false>._M_head_impl;
        if (_Var4._M_head_impl != (BoundCastData *)0x0) {
          (*(_Var4._M_head_impl)->_vptr_BoundCastData[1])();
        }
        (__return_storage_ptr__->cast_data).
        super_unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>_>._M_t.
        super___uniq_ptr_impl<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>_>.
        _M_t.
        super__Tuple_impl<0UL,_duckdb::BoundCastData_*,_std::default_delete<duckdb::BoundCastData>_>
        .super__Head_base<0UL,_duckdb::BoundCastData_*,_false>._M_head_impl = (BoundCastData *)0x0;
      } while (__n != 0);
    }
    local_78._M_head_impl = (BoundCastData *)0x0;
    BoundCastInfo::BoundCastInfo
              (__return_storage_ptr__,DefaultCasts::TryVectorNullCast,
               (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                *)&local_78,(init_cast_local_state_t)0x0);
    _Var4._M_head_impl = local_78._M_head_impl;
  }
  if (_Var4._M_head_impl != (BoundCastData *)0x0) {
    (*(_Var4._M_head_impl)->_vptr_BoundCastData[1])();
  }
  return __return_storage_ptr__;
}

Assistant:

BoundCastInfo CastFunctionSet::GetCastFunction(const LogicalType &source, const LogicalType &target,
                                               GetCastFunctionInput &get_input) {
	if (source == target) {
		return DefaultCasts::NopCast;
	}
	// the first function is the default
	// we iterate the set of bind functions backwards
	for (idx_t i = bind_functions.size(); i > 0; i--) {
		auto &bind_function = bind_functions[i - 1];
		BindCastInput input(*this, bind_function.info.get(), get_input.context);
		input.query_location = get_input.query_location;
		auto result = bind_function.function(input, source, target);
		if (result.function) {
			// found a cast function! return it
			return result;
		}
	}
	// no cast found: return the default null cast
	return DefaultCasts::TryVectorNullCast;
}